

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsontz.cpp
# Opt level: O2

int32_t __thiscall
icu_63::OlsonTimeZone::countTransitionRules(OlsonTimeZone *this,UErrorCode *status)

{
  int iVar1;
  ulong uVar2;
  ushort uVar3;
  int32_t iVar4;
  
  iVar4 = 0;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    checkTransitionRules(this,status);
    iVar4 = 0;
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      if (this->historicRules == (TimeArrayTimeZoneRule **)0x0) {
        iVar4 = 0;
      }
      else {
        uVar2 = 0;
        uVar3 = (ushort)*(undefined4 *)&this->historicRuleCount;
        if ((short)uVar3 < 1) {
          uVar3 = 0;
        }
        iVar4 = 0;
        for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
          iVar4 = (iVar4 + 1) - (uint)(this->historicRules[uVar2] == (TimeArrayTimeZoneRule *)0x0);
        }
      }
      if (this->finalZone != (SimpleTimeZone *)0x0) {
        iVar1 = (*(this->finalZone->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject
                  [9])();
        if ((char)iVar1 == '\0') {
          iVar4 = iVar4 + 1;
        }
        else {
          iVar4 = iVar4 + 2;
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int32_t
OlsonTimeZone::countTransitionRules(UErrorCode& status) const {
    if (U_FAILURE(status)) {
        return 0;
    }
    checkTransitionRules(status);
    if (U_FAILURE(status)) {
        return 0;
    }

    int32_t count = 0;
    if (historicRules != NULL) {
        // historicRules may contain null entries when original zoneinfo data
        // includes non transition data.
        for (int32_t i = 0; i < historicRuleCount; i++) {
            if (historicRules[i] != NULL) {
                count++;
            }
        }
    }
    if (finalZone != NULL) {
        if (finalZone->useDaylightTime()) {
            count += 2;
        } else {
            count++;
        }
    }
    return count;
}